

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O3

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::internal::assign_op<double,double>>
               (Matrix<double,__1,__1,_1,__1,__1> *dst,
               CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
               *src,assign_op<double,_double> *func)

{
  double dVar1;
  ulong cols;
  double *pdVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  undefined8 *puVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  dVar1 = (src->m_functor).m_other;
  uVar6 = (src->m_rows).m_value;
  cols = (src->m_cols).m_value;
  if (((dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows !=
       uVar6) ||
     (uVar5 = cols, uVar8 = uVar6,
     (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols !=
     cols)) {
    if ((long)(cols | uVar6) < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ilanolkies[P]metnum-tp2/eigen/Eigen/src/Core/PlainObjectBase.h"
                    ,0x11d,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                   );
    }
    if ((cols != 0 && uVar6 != 0) &&
       (auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       SUB168(auVar3 / SEXT816((long)cols),0) < (long)uVar6)) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(8,src,SUB168(auVar3 % SEXT816((long)cols),0));
      *puVar7 = operator_delete;
      __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    DenseStorage<double,_-1,_-1,_-1,_1>::resize
              ((DenseStorage<double,__1,__1,__1,_1> *)dst,cols * uVar6,uVar6,cols);
    uVar8 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows
    ;
    uVar5 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols
    ;
  }
  if ((uVar8 == uVar6) && (uVar5 == cols)) {
    pdVar2 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
             m_data;
    lVar9 = cols * uVar6;
    uVar6 = lVar9 - (lVar9 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < lVar9) {
      lVar11 = 0;
      do {
        pdVar2[lVar11] = dVar1;
        (pdVar2 + lVar11)[1] = dVar1;
        lVar11 = lVar11 + 2;
      } while (lVar11 < (long)uVar6);
    }
    auVar4 = _DAT_00122030;
    auVar3 = _DAT_00122020;
    lVar11 = lVar9 % 2;
    if (lVar11 != 0 && (long)uVar6 <= lVar9) {
      lVar10 = lVar11 + -1;
      auVar12._8_4_ = (int)lVar10;
      auVar12._0_8_ = lVar10;
      auVar12._12_4_ = (int)((ulong)lVar10 >> 0x20);
      uVar6 = 0;
      auVar12 = auVar12 ^ _DAT_00122030;
      do {
        auVar13._8_4_ = (int)uVar6;
        auVar13._0_8_ = uVar6;
        auVar13._12_4_ = (int)(uVar6 >> 0x20);
        auVar13 = (auVar13 | auVar3) ^ auVar4;
        if ((bool)(~(auVar13._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar13._0_4_ ||
                    auVar12._4_4_ < auVar13._4_4_) & 1)) {
          pdVar2[(lVar9 / 2) * 2 + uVar6] = dVar1;
        }
        if ((auVar13._12_4_ != auVar12._12_4_ || auVar13._8_4_ <= auVar12._8_4_) &&
            auVar13._12_4_ <= auVar12._12_4_) {
          pdVar2[(lVar9 / 2) * 2 + uVar6 + 1] = dVar1;
        }
        uVar6 = uVar6 + 2;
      } while ((lVar11 + 1U & 0xfffffffffffffffe) != uVar6);
    }
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ilanolkies[P]metnum-tp2/eigen/Eigen/src/Core/AssignEvaluator.h"
                ,0x2eb,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1, 1>, SrcXprType = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>, T1 = double, T2 = double]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);
    
  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}